

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.cc
# Opt level: O0

bool __thiscall absl::StrContainsIgnoreCase(absl *this,string_view haystack,char needle)

{
  uchar c;
  char cVar1;
  size_type sVar2;
  string_view haystack_00;
  char local_3b;
  char local_3a;
  undefined1 local_39;
  absl *paStack_38;
  char both_cstr [3];
  undefined1 auStack_20 [5];
  char lower_needle;
  char upper_needle;
  char needle_local;
  string_view haystack_local;
  
  haystack_local._M_len = haystack._M_len;
  c = (uchar)haystack._M_str;
  _auStack_20 = this;
  cVar1 = ascii_toupper(c);
  local_3b = ascii_tolower(c);
  if (cVar1 == local_3b) {
    paStack_38 = _auStack_20;
    haystack_00._M_str._0_4_ = (int)(char)c;
    haystack_00._M_len = haystack_local._M_len;
    haystack_00._M_str._4_4_ = 0;
    haystack_local._M_str._7_1_ = StrContains(_auStack_20,haystack_00,local_3b);
  }
  else {
    local_39 = 0;
    local_3a = cVar1;
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                      ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,&local_3b,0);
    haystack_local._M_str._7_1_ = sVar2 != 0xffffffffffffffff;
  }
  return haystack_local._M_str._7_1_;
}

Assistant:

bool StrContainsIgnoreCase(absl::string_view haystack,
                           char needle) noexcept {
  char upper_needle = absl::ascii_toupper(static_cast<unsigned char>(needle));
  char lower_needle = absl::ascii_tolower(static_cast<unsigned char>(needle));
  if (upper_needle == lower_needle) {
    return StrContains(haystack, needle);
  } else {
    const char both_cstr[3] = {lower_needle, upper_needle, '\0'};
    return haystack.find_first_of(both_cstr) != absl::string_view::npos;
  }
}